

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<int>::setCapacity(Vector<int> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<int>_conflict *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<int>_conflict newBuilder;
  size_t newSize_local;
  Vector<int> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<int>::size((ArrayBuilder<int> *)this);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<int>::truncate((ArrayBuilder<int> *)this,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<int>((ArrayBuilder<int> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<int>>(&this->builder);
  ArrayBuilder<int>::addAll<kj::ArrayBuilder<int>>((ArrayBuilder<int> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<int>>((ArrayBuilder<int>_conflict *)local_38);
  ArrayBuilder<int>::operator=((ArrayBuilder<int> *)this,pAVar2);
  ArrayBuilder<int>::~ArrayBuilder((ArrayBuilder<int> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }